

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_data_edge.h
# Opt level: O0

string_view absl::lts_20240722::cord_internal::EdgeData(CordRep *edge)

{
  size_type __len;
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRepFlat *this;
  char *pcVar3;
  CordRepExternal *pCVar4;
  size_t length;
  size_t offset;
  CordRep *edge_local;
  
  bVar1 = IsDataEdge(edge);
  if (bVar1) {
    length = 0;
    __len = edge->length;
    bVar1 = CordRep::IsSubstring(edge);
    offset = (size_t)edge;
    if (bVar1) {
      pCVar2 = CordRep::substring(edge);
      length = pCVar2->start;
      pCVar2 = CordRep::substring(edge);
      offset = (size_t)pCVar2->child;
    }
    if (*(byte *)(offset + 0xc) < 6) {
      pCVar4 = CordRep::external((CordRep *)offset);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&edge_local,
                 pCVar4->base + length,__len);
    }
    else {
      this = CordRep::flat((CordRep *)offset);
      pcVar3 = CordRepFlat::Data(this);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&edge_local,pcVar3 + length,
                 __len);
    }
    return _edge_local;
  }
  __assert_fail("IsDataEdge(edge)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
}

Assistant:

inline absl::string_view EdgeData(const CordRep* edge) {
  assert(IsDataEdge(edge));

  size_t offset = 0;
  const size_t length = edge->length;
  if (edge->IsSubstring()) {
    offset = edge->substring()->start;
    edge = edge->substring()->child;
  }
  return edge->tag >= FLAT
             ? absl::string_view{edge->flat()->Data() + offset, length}
             : absl::string_view{edge->external()->base + offset, length};
}